

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare_unknown_test.cc
# Opt level: O2

upb_UnknownCompareResult
CompareUnknownWithMaxDepth(UnknownFields *uf1,UnknownFields *uf2,int max_depth)

{
  upb_UnknownCompareResult uVar1;
  upb_Arena *arena;
  upb_Arena *arena_00;
  protobuf_test_messages_proto2_TestAllTypesProto2 *msg;
  protobuf_test_messages_proto2_TestAllTypesProto2 *msg_00;
  Arena arena2;
  Arena arena1;
  string buf2;
  string buf1;
  unique_ptr<upb_Arena,_void_(*)(upb_Arena_*)> local_90;
  unique_ptr<upb_Arena,_void_(*)(upb_Arena_*)> local_80;
  string local_70;
  string local_50;
  
  arena = upb_Arena_New();
  local_80._M_t.super___uniq_ptr_impl<upb_Arena,_void_(*)(upb_Arena_*)>._M_t.
  super__Tuple_impl<0UL,_upb_Arena_*,_void_(*)(upb_Arena_*)>.
  super__Tuple_impl<1UL,_void_(*)(upb_Arena_*)>.super__Head_base<1UL,_void_(*)(upb_Arena_*),_false>.
  _M_head_impl = (_Head_base<1UL,_void_(*)(upb_Arena_*),_false>)upb_Arena_Free;
  local_80._M_t.super___uniq_ptr_impl<upb_Arena,_void_(*)(upb_Arena_*)>._M_t.
  super__Tuple_impl<0UL,_upb_Arena_*,_void_(*)(upb_Arena_*)>.
  super__Head_base<0UL,_upb_Arena_*,_false>._M_head_impl = arena;
  arena_00 = upb_Arena_New();
  local_90._M_t.super___uniq_ptr_impl<upb_Arena,_void_(*)(upb_Arena_*)>._M_t.
  super__Tuple_impl<0UL,_upb_Arena_*,_void_(*)(upb_Arena_*)>.
  super__Tuple_impl<1UL,_void_(*)(upb_Arena_*)>.super__Head_base<1UL,_void_(*)(upb_Arena_*),_false>.
  _M_head_impl = (_Head_base<1UL,_void_(*)(upb_Arena_*),_false>)upb_Arena_Free;
  local_90._M_t.super___uniq_ptr_impl<upb_Arena,_void_(*)(upb_Arena_*)>._M_t.
  super__Tuple_impl<0UL,_upb_Arena_*,_void_(*)(upb_Arena_*)>.
  super__Head_base<0UL,_upb_Arena_*,_false>._M_head_impl = arena_00;
  msg = protobuf_test_messages_proto2_TestAllTypesProto2_new(arena);
  msg_00 = protobuf_test_messages_proto2_TestAllTypesProto2_new(arena_00);
  ToBinaryPayload_abi_cxx11_(&local_50,uf1);
  ToBinaryPayload_abi_cxx11_(&local_70,uf2);
  _upb_Message_AddUnknown_dont_copy_me__upb_internal_use_only
            (&msg->base_dont_copy_me__upb_internal_use_only,local_50._M_dataplus._M_p,
             local_50._M_string_length,
             local_80._M_t.super___uniq_ptr_impl<upb_Arena,_void_(*)(upb_Arena_*)>._M_t.
             super__Tuple_impl<0UL,_upb_Arena_*,_void_(*)(upb_Arena_*)>.
             super__Head_base<0UL,_upb_Arena_*,_false>._M_head_impl,false);
  _upb_Message_AddUnknown_dont_copy_me__upb_internal_use_only
            (&msg_00->base_dont_copy_me__upb_internal_use_only,local_70._M_dataplus._M_p,
             local_70._M_string_length,
             local_90._M_t.super___uniq_ptr_impl<upb_Arena,_void_(*)(upb_Arena_*)>._M_t.
             super__Tuple_impl<0UL,_upb_Arena_*,_void_(*)(upb_Arena_*)>.
             super__Head_base<0UL,_upb_Arena_*,_false>._M_head_impl,false);
  uVar1 = _upb_Message_UnknownFieldsAreEqual_dont_copy_me__upb_internal_use_only
                    (&msg->base_dont_copy_me__upb_internal_use_only,
                     &msg_00->base_dont_copy_me__upb_internal_use_only,max_depth);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::unique_ptr<upb_Arena,_void_(*)(upb_Arena_*)>::~unique_ptr(&local_90);
  std::unique_ptr<upb_Arena,_void_(*)(upb_Arena_*)>::~unique_ptr(&local_80);
  return uVar1;
}

Assistant:

upb_UnknownCompareResult CompareUnknownWithMaxDepth(UnknownFields uf1,
                                                    UnknownFields uf2,
                                                    int max_depth) {
  upb::Arena arena1;
  upb::Arena arena2;
  protobuf_test_messages_proto2_TestAllTypesProto2* msg1 =
      protobuf_test_messages_proto2_TestAllTypesProto2_new(arena1.ptr());
  protobuf_test_messages_proto2_TestAllTypesProto2* msg2 =
      protobuf_test_messages_proto2_TestAllTypesProto2_new(arena2.ptr());
  // Add the unknown fields to the messages.
  std::string buf1 = ToBinaryPayload(uf1);
  std::string buf2 = ToBinaryPayload(uf2);
  UPB_PRIVATE(_upb_Message_AddUnknown)(UPB_UPCAST(msg1), buf1.data(),
                                       buf1.size(), arena1.ptr(), false);
  UPB_PRIVATE(_upb_Message_AddUnknown)(UPB_UPCAST(msg2), buf2.data(),
                                       buf2.size(), arena2.ptr(), false);
  return UPB_PRIVATE(_upb_Message_UnknownFieldsAreEqual)(
      UPB_UPCAST(msg1), UPB_UPCAST(msg2), max_depth);
}